

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

uint32_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<unsigned_int>(OgreXmlSerializer *this,char *name)

{
  XmlReader *pXVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[7])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    pXVar1 = this->m_reader;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_52);
    ThrowAttibuteError(pXVar1,&local_30,&local_50);
  }
  uVar3 = ReadAttribute<int>(this,name);
  if (-1 < (int)uVar3) {
    return uVar3;
  }
  pXVar1 = this->m_reader;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Found a negative number value where expecting a uint32_t value",
             &local_52);
  ThrowAttibuteError(pXVar1,&local_30,&local_50);
}

Assistant:

uint32_t OgreXmlSerializer::ReadAttribute<uint32_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        /** @note This is hackish. But we are never expecting unsigned values that go outside the
            int32_t range. Just monitor for negative numbers and kill the import. */
        int32_t temp = ReadAttribute<int32_t>(name);
        if (temp >= 0)
        {
            return static_cast<uint32_t>(temp);
        }
        else
        {
            ThrowAttibuteError(m_reader, name, "Found a negative number value where expecting a uint32_t value");
        }
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
    }
    return 0;
}